

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O3

rotation_t * opengv::math::cayley2rot_reduced(cayley_t *cayley)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  rotation_t *R;
  rotation_t *in_RDI;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar1 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2];
  dVar5 = 1.0 - dVar1 * dVar1;
  auVar2 = *(undefined1 (*) [16])
            ((cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array + 1);
  dVar8 = auVar2._0_8_;
  dVar3 = dVar8 * dVar8;
  auVar10._0_8_ = dVar8 * dVar8;
  auVar10._8_8_ = auVar2._8_8_ * auVar2._8_8_;
  auVar4 = vshufpd_avx(auVar2,auVar2,1);
  auVar6 = vfmsub213pd_fma(auVar4,auVar7,auVar2);
  auVar4 = vshufpd_avx(auVar10,auVar10,1);
  dVar8 = auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       ((dVar1 * dVar1 + 1.0) - dVar3) - dVar8;
  auVar4 = vfmadd213sd_fma(auVar9,auVar7,auVar2);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar4._0_8_ + auVar4._0_8_;
  auVar4 = vfmadd213sd_fma(auVar2,auVar7,auVar9);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       auVar4._0_8_ + auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       (dVar5 + dVar3) - dVar8;
  auVar4 = vfmsub213sd_fma(auVar9,auVar2,auVar7);
  auVar2 = vfmadd213sd_fma(auVar9,auVar2,auVar7);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar4._0_8_ + auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       auVar6._0_8_ + auVar6._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       auVar6._8_8_ + auVar6._8_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       auVar2._0_8_ + auVar2._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       (dVar5 - dVar3) + dVar8;
  return in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::cayley2rot_reduced( const cayley_t & cayley)
{
  rotation_t R;

  R(0,0) = 1+pow(cayley[0],2)-pow(cayley[1],2)-pow(cayley[2],2);
  R(0,1) = 2*(cayley[0]*cayley[1]-cayley[2]);
  R(0,2) = 2*(cayley[0]*cayley[2]+cayley[1]);
  R(1,0) = 2*(cayley[0]*cayley[1]+cayley[2]);
  R(1,1) = 1-pow(cayley[0],2)+pow(cayley[1],2)-pow(cayley[2],2);
  R(1,2) = 2*(cayley[1]*cayley[2]-cayley[0]);
  R(2,0) = 2*(cayley[0]*cayley[2]-cayley[1]);
  R(2,1) = 2*(cayley[1]*cayley[2]+cayley[0]);
  R(2,2) = 1-pow(cayley[0],2)-pow(cayley[1],2)+pow(cayley[2],2);

  return R;
}